

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::printLit(SAT *this,Lit p)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ChannelInfo *pCVar5;
  Propagator **ppPVar6;
  vec<int> *this_00;
  uint *puVar7;
  uchar *in_RCX;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  Lit in_ESI;
  uchar *puVar8;
  long in_RDI;
  size_t in_R8;
  ChannelInfo *ci;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  Propagator *pPVar9;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  ::var(in_ESI);
  bVar1 = isRootLevel((SAT *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),iVar4);
  if (!bVar1) {
    uVar2 = toInt(in_ESI);
    printf("%d:",(ulong)uVar2);
    uVar2 = ::var(in_ESI);
    puVar8 = (uchar *)(ulong)uVar2;
    pCVar5 = vec<ChannelInfo>::operator[]((vec<ChannelInfo> *)(in_RDI + 0x30),uVar2);
    if ((*(uint *)pCVar5 >> 0x1d & 3) == 1) {
      puVar8 = (uchar *)(ulong)(*(uint *)pCVar5 & 0x1fffffff);
      vec<IntVar_*>::operator[](&engine.vars,*(uint *)pCVar5 & 0x1fffffff);
      sign((EVP_PKEY_CTX *)(ulong)(uint)in_ESI.x,puVar8,siglen_00,in_RCX,in_R8);
      IntVar::printLit((IntVar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (LitRel)in_stack_ffffffffffffff88);
    }
    else if ((*(uint *)pCVar5 >> 0x1d & 3) == 2) {
      puVar8 = (uchar *)(ulong)(*(uint *)pCVar5 & 0x1fffffff);
      ppPVar6 = vec<Propagator_*>::operator[](&engine.propagators,*(uint *)pCVar5 & 0x1fffffff);
      pPVar9 = *ppPVar6;
      uVar2 = pCVar5->val;
      uVar3 = sign((EVP_PKEY_CTX *)(ulong)(uint)in_ESI.x,puVar8,siglen_01,in_RCX,in_R8);
      (*pPVar9->_vptr_Propagator[8])(pPVar9,(ulong)uVar2,(ulong)(uVar3 & 1));
    }
    else {
      iVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)in_ESI.x,puVar8,siglen,in_RCX,in_R8);
      uVar3 = (uint)((byte)iVar4 & 1);
      this_00 = (vec<int> *)(in_RDI + 0x70);
      uVar2 = ::var(in_ESI);
      puVar7 = (uint *)vec<int>::operator[](this_00,uVar2);
      printf(":%d:%d, ",(ulong)uVar3,(ulong)*puVar7);
    }
  }
  return;
}

Assistant:

void SAT::printLit(Lit p) {
	if (isRootLevel(var(p))) {
		return;
	}
	printf("%d:", toInt(p));
	const ChannelInfo& ci = c_info[var(p)];
	if (ci.cons_type == 1) {
		engine.vars[ci.cons_id]->printLit(
				ci.val, static_cast<LitRel>(ci.val_type * 3 ^ static_cast<int>(sign(p))));
	} else if (ci.cons_type == 2) {
		engine.propagators[ci.cons_id]->printLit(ci.val, sign(p));
	} else {
		printf(":%d:%d, ", static_cast<int>(sign(p)), trailpos[var(p)]);
	}
}